

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OledPixel.cxx
# Opt level: O1

void __thiscall SSD1306::OledPixel::setFrom(OledPixel *this,OledPixel *pixels,OledPoint offset)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong local_60;
  ulong local_58;
  
  uVar1 = (*this->_vptr_OledPixel[8])();
  iVar2 = (*pixels->_vptr_OledPixel[8])(pixels);
  uVar3 = iVar2 + offset.m_x;
  if ((int)uVar1 <= (int)uVar3) {
    uVar3 = uVar1;
  }
  uVar9 = offset.m_y;
  uVar1 = 0;
  if (uVar9 != 0 && -1 < (long)offset) {
    uVar1 = uVar9;
  }
  uVar4 = (*this->_vptr_OledPixel[9])(this);
  iVar2 = (*pixels->_vptr_OledPixel[9])(pixels);
  uVar5 = iVar2 + uVar9;
  if ((int)uVar4 <= (int)(iVar2 + uVar9)) {
    uVar5 = uVar4;
  }
  if ((int)uVar1 < (int)uVar5) {
    uVar6 = 0;
    if (0 < offset.m_x) {
      uVar6 = (ulong)offset & 0xffffffff;
    }
    local_60 = (ulong)uVar1;
    local_58 = local_60 << 0x20 | uVar6;
    do {
      if ((int)uVar6 < (int)uVar3) {
        lVar7 = uVar3 - uVar6;
        uVar8 = uVar6 - (long)offset;
        uVar10 = local_58;
        do {
          iVar2 = (*pixels->_vptr_OledPixel[4])
                            (pixels,uVar8 & 0xffffffff | (ulong)((int)local_60 - uVar9) << 0x20);
          (*this->_vptr_OledPixel[(ulong)(byte)((byte)iVar2 ^ 1) + 5])(this,uVar10);
          uVar10 = uVar10 + 1;
          uVar8 = uVar8 + 1;
          lVar7 = lVar7 + -1;
        } while (lVar7 != 0);
      }
      local_60 = local_60 + 1;
      local_58 = local_58 + 0x100000000;
    } while (local_60 != uVar5);
  }
  return;
}

Assistant:

void
SSD1306::OledPixel::setFrom(
    const OledPixel& pixels,
    SSD1306::OledPoint offset)
{
    auto xStart = std::max(0, offset.x());
    auto xEnd = std::min(width(), pixels.width() + offset.x());
    auto yStart = std::max(0, offset.y());
    auto yEnd = std::min(height(), pixels.height() + offset.y());

    for (auto y = yStart ; y < yEnd ; ++y)
    {
        for (auto x = xStart ; x < xEnd ; ++x)
        {
            OledPoint inputP{x - offset.x(), y - offset.y()};
            OledPoint outputP{x, y};

            if (pixels.isSetPixel(inputP))
            {
                setPixel(outputP);
            }
            else
            {
                unsetPixel(outputP);
            }
        }
    }
}